

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::validate(CommandLine<Catch::ConfigData> *this)

{
  pointer pAVar1;
  logic_error *this_00;
  pointer this_01;
  
  this_01 = (this->m_options).
            super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (this->m_options).
           super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((this_01 == pAVar1) &&
      ((this->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
     ((this->m_floatingArg)._M_t.
      super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
      .super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>.
      _M_head_impl == (Arg *)0x0)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"No options or arguments specified");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  for (; this_01 != pAVar1; this_01 = this_01 + 1) {
    CommonArgProperties<Catch::ConfigData>::validate
              (&this_01->super_CommonArgProperties<Catch::ConfigData>);
  }
  return;
}

Assistant:

Equals( std::string const& str, CaseSensitive::Choice caseSensitivity = CaseSensitive::Yes )
            :   m_data( str, caseSensitivity )
            {}